

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

Curl_hash_element * Curl_hash_next_element(Curl_hash_iterator *iter)

{
  Curl_hash *pCVar1;
  Curl_llist_node *pCVar2;
  Curl_hash_element *he;
  size_t i;
  Curl_hash *h;
  Curl_hash_iterator *iter_local;
  
  pCVar1 = iter->hash;
  if (pCVar1->table == (Curl_llist *)0x0) {
    iter_local = (Curl_hash_iterator *)0x0;
  }
  else {
    if (iter->current_element != (Curl_llist_node *)0x0) {
      pCVar2 = Curl_node_next(iter->current_element);
      iter->current_element = pCVar2;
    }
    if (iter->current_element == (Curl_llist_node *)0x0) {
      for (he = (Curl_hash_element *)iter->slot_index; he < (Curl_hash_element *)pCVar1->slots;
          he = (Curl_hash_element *)((long)&(he->list)._list + 1)) {
        pCVar2 = Curl_llist_head(pCVar1->table + (long)he);
        if (pCVar2 != (Curl_llist_node *)0x0) {
          pCVar2 = Curl_llist_head(pCVar1->table + (long)he);
          iter->current_element = pCVar2;
          iter->slot_index = (size_t)((long)&(he->list)._list + 1);
          break;
        }
      }
    }
    if (iter->current_element == (Curl_llist_node *)0x0) {
      iter_local = (Curl_hash_iterator *)0x0;
    }
    else {
      iter_local = (Curl_hash_iterator *)Curl_node_elem(iter->current_element);
    }
  }
  return (Curl_hash_element *)iter_local;
}

Assistant:

struct Curl_hash_element *
Curl_hash_next_element(struct Curl_hash_iterator *iter)
{
  struct Curl_hash *h;
  DEBUGASSERT(iter->init == ITERINIT);
  h = iter->hash;
  if(!h->table)
    return NULL; /* empty hash, nothing to return */

  /* Get the next element in the current list, if any */
  if(iter->current_element)
    iter->current_element = Curl_node_next(iter->current_element);

  /* If we have reached the end of the list, find the next one */
  if(!iter->current_element) {
    size_t i;
    for(i = iter->slot_index; i < h->slots; i++) {
      if(Curl_llist_head(&h->table[i])) {
        iter->current_element = Curl_llist_head(&h->table[i]);
        iter->slot_index = i + 1;
        break;
      }
    }
  }

  if(iter->current_element) {
    struct Curl_hash_element *he = Curl_node_elem(iter->current_element);
    return he;
  }
  return NULL;
}